

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reldtfmt.cpp
# Opt level: O3

void __thiscall
icu_63::anon_unknown_20::RelDateFmtDataSink::put
          (RelDateFmtDataSink *this,char *key,ResourceValue *value,UBool param_3,
          UErrorCode *errorCode)

{
  int iVar1;
  URelativeString *pUVar2;
  UBool UVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  int i;
  int32_t len;
  ResourceTable relDayTable;
  int32_t local_6c;
  char *local_68;
  UErrorCode *local_60;
  ResourceTable local_58;
  
  local_68 = key;
  local_60 = errorCode;
  (*(value->super_UObject)._vptr_UObject[0xb])
            (&local_58,value,errorCode,CONCAT71(in_register_00000009,param_3));
  local_6c = 0;
  UVar3 = ResourceTable::getKeyAndValue(&local_58,0,&local_68,value);
  if (UVar3 != '\0') {
    i = 1;
    do {
      iVar4 = atoi(local_68);
      iVar1 = iVar4 + 2;
      if (iVar1 < this->fDatesLen) {
        if (this->fDatesPtr[iVar1].string == (UChar *)0x0) {
          this->fDatesPtr[iVar1].offset = iVar4;
          iVar4 = (*(value->super_UObject)._vptr_UObject[4])(value,&local_6c,local_60);
          pUVar2 = this->fDatesPtr;
          pUVar2[iVar1].string = (UChar *)CONCAT44(extraout_var,iVar4);
          pUVar2[iVar1].len = local_6c;
        }
      }
      UVar3 = ResourceTable::getKeyAndValue(&local_58,i,&local_68,value);
      i = i + 1;
    } while (UVar3 != '\0');
  }
  return;
}

Assistant:

virtual void put(const char *key, ResourceValue &value,
                   UBool /*noFallback*/, UErrorCode &errorCode) {
      ResourceTable relDayTable = value.getTable(errorCode);
      int32_t n = 0;
      int32_t len = 0;
      for (int32_t i = 0; relDayTable.getKeyAndValue(i, key, value); ++i) {
        // Find the relative offset.
        int32_t offset = atoi(key);

        // Put in the proper spot, but don't override existing data.
        n = offset + UDAT_DIRECTION_THIS; // Converts to index in UDAT_R
        if (n < fDatesLen && fDatesPtr[n].string == NULL) {
          // Not found and n is an empty slot.
          fDatesPtr[n].offset = offset;
          fDatesPtr[n].string = value.getString(len, errorCode);
          fDatesPtr[n].len = len;
        }
      }
  }